

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteRuleFiles(cmMakefileLibraryTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteCommonCodeRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetLanguageFlags(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar2 - STATIC_LIBRARY < 3 || TVar2 == OBJECT_LIBRARY) {
    switch((long)&switchD_00943954::switchdataD_00bcb634 +
           (long)(int)(&switchD_00943954::switchdataD_00bcb634)[TVar2 - STATIC_LIBRARY]) {
    case 0x943956:
      WriteStaticLibraryRules(this);
      break;
    case 0x943964:
      WriteSharedLibraryRules(this,false);
      bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,
                         &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          ConfigName);
      if (bVar1) {
        WriteSharedLibraryRules(this,true);
      }
      break;
    case 0x943996:
      WriteModuleLibraryRules(this,false);
      bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,
                         &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                          ConfigName);
      if (bVar1) {
        WriteModuleLibraryRules(this,true);
      }
      break;
    case 0x9439c8:
      WriteObjectLibraryRules(this);
    }
  }
  else {
    cmSystemTools::Error("Unknown Library Type",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  cmMakefileTargetGenerator::WriteTargetRequiresRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
    _vptr_cmCommonTargetGenerator[5])();
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteRuleFiles()
{
  // create the build.make file and directory, put in the common blocks
  this->CreateRuleFile();

  // write rules used to help build object files
  this->WriteCommonCodeRules();

  // write the per-target per-language flags
  this->WriteTargetLanguageFlags();

  // write in rules for object files and custom commands
  this->WriteTargetBuildRules();

  // write the link rules
  // Write the rule for this target type.
  switch (this->GeneratorTarget->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      this->WriteStaticLibraryRules();
      break;
    case cmStateEnums::SHARED_LIBRARY:
      this->WriteSharedLibraryRules(false);
      if (this->GeneratorTarget->NeedRelinkBeforeInstall(this->ConfigName)) {
        // Write rules to link an installable version of the target.
        this->WriteSharedLibraryRules(true);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      this->WriteModuleLibraryRules(false);
      if (this->GeneratorTarget->NeedRelinkBeforeInstall(this->ConfigName)) {
        // Write rules to link an installable version of the target.
        this->WriteModuleLibraryRules(true);
      }
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      this->WriteObjectLibraryRules();
      break;
    default:
      // If language is not known, this is an error.
      cmSystemTools::Error("Unknown Library Type");
      break;
  }

  // Write the requires target.
  this->WriteTargetRequiresRules();

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}